

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLimit::ChLinkLimit(ChLinkLimit *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  byte bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ChFunction *__tmp;
  
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->constr_upper);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->constr_lower);
  this->m_active = false;
  this->m_penalty_only = false;
  this->m_polar = false;
  this->m_rotation = false;
  this->m_max = 1.0;
  this->m_min = -1.0;
  this->m_maxCushion = 0.0;
  this->m_minCushion = 0.0;
  this->m_Kmax = 1000.0;
  this->m_Kmin = 1000.0;
  this->m_Rmax = 100.0;
  this->m_Rmin = 100.0;
  this->m_maxElastic = 0.0;
  this->m_minElastic = 0.0;
  (this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_polarMax_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_polarMax_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0x3ff00000;
  (this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  p_Var1 = (this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0x3ff00000;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  p_Var1 = (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0x3ff00000;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  p_Var1 = (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0x3ff00000;
  (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  p_Var1 = (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0x3ff00000;
  (this->m_polarMax_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var3 + 1);
  p_Var1 = (this->m_polarMax_funct).
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_polarMax_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->constr_upper).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_UNILATERAL;
  if ((((this->constr_upper).super_ChConstraintTwo.super_ChConstraint.valid == true) &&
      ((this->constr_upper).super_ChConstraintTwo.super_ChConstraint.disabled == false)) &&
     ((this->constr_upper).super_ChConstraintTwo.super_ChConstraint.redundant == false)) {
    bVar2 = (this->constr_upper).super_ChConstraintTwo.super_ChConstraint.broken ^ 1;
  }
  else {
    bVar2 = false;
  }
  (this->constr_upper).super_ChConstraintTwo.super_ChConstraint.active = (bool)bVar2;
  (this->constr_lower).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_UNILATERAL;
  if ((((this->constr_lower).super_ChConstraintTwo.super_ChConstraint.valid == true) &&
      ((this->constr_lower).super_ChConstraintTwo.super_ChConstraint.disabled == false)) &&
     ((this->constr_lower).super_ChConstraintTwo.super_ChConstraint.redundant == false)) {
    bVar2 = (this->constr_lower).super_ChConstraintTwo.super_ChConstraint.broken ^ 1;
  }
  else {
    bVar2 = false;
  }
  (this->constr_lower).super_ChConstraintTwo.super_ChConstraint.active = (bool)bVar2;
  return;
}

Assistant:

ChLinkLimit::ChLinkLimit()
    : m_active(false),
      m_penalty_only(false),
      m_polar(false),
      m_rotation(false),
      m_max(1),
      m_min(-1),
      m_maxCushion(0),
      m_minCushion(0),
      m_Kmax(1000),
      m_Kmin(1000),
      m_Rmax(100),
      m_Rmin(100),
      m_minElastic(0),
      m_maxElastic(0) {
    // Default: no modulation
    m_Kmax_modul = chrono_types::make_shared<ChFunction_Const>(1);
    m_Kmin_modul = chrono_types::make_shared<ChFunction_Const>(1);
    m_Rmax_modul = chrono_types::make_shared<ChFunction_Const>(1);
    m_Rmin_modul = chrono_types::make_shared<ChFunction_Const>(1);
    m_polarMax_funct = chrono_types::make_shared<ChFunction_Const>(1);

    constr_upper.SetMode(CONSTRAINT_UNILATERAL);
    constr_lower.SetMode(CONSTRAINT_UNILATERAL);
}